

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::IsValid(ON_NurbsCurve *this,ON_TextLog *text_log)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined1 local_68 [8];
  ON_3dPoint P1;
  ON_3dPoint P0;
  int i;
  int zcount;
  double *w;
  double sign;
  ON_TextLog *text_log_local;
  ON_NurbsCurve *this_local;
  
  if (this->m_dim < 1) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_NurbsCurve.m_dim = %d (should be > 0).\n",
                        (ulong)(uint)this->m_dim);
    }
    this_local._7_1_ = ON_NurbsCurveIsNotValid();
  }
  else if (this->m_order < 2) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_NurbsCurve.m_order = %d (should be >= 2).\n",
                        (ulong)(uint)this->m_order);
    }
    this_local._7_1_ = ON_NurbsCurveIsNotValid();
  }
  else if (this->m_cv_count < this->m_order) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n",
                        (ulong)(uint)this->m_cv_count,(ulong)(uint)this->m_order);
    }
    this_local._7_1_ = ON_NurbsCurveIsNotValid();
  }
  else {
    iVar5 = this->m_cv_stride;
    iVar3 = CVSize(this);
    if ((iVar5 < iVar3) && (text_log != (ON_TextLog *)0x0)) {
      uVar1 = this->m_cv_stride;
      uVar4 = CVSize(this);
      ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n",(ulong)uVar1,
                        (ulong)uVar4);
    }
    if (this->m_cv == (double *)0x0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv is nullptr.\n");
      }
      this_local._7_1_ = ON_NurbsCurveIsNotValid();
    }
    else if (this->m_knot == (double *)0x0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_NurbsCurve.m_knot is nullptr.\n");
      }
      this_local._7_1_ = ON_NurbsCurveIsNotValid();
    }
    else {
      bVar2 = ON_IsValidKnotVector(this->m_order,this->m_cv_count,this->m_knot,text_log);
      if (bVar2) {
        iVar5 = CVSize(this);
        bVar2 = ON_ControlPointsAreValid
                          (iVar5,this->m_cv_count,this->m_cv_stride,this->m_cv,text_log);
        if (bVar2) {
          if (this->m_is_rat != 0) {
            w = (double *)0x0;
            _i = this->m_cv + this->m_dim;
            P0.z._4_4_ = 0;
            for (P0.z._0_4_ = 0; (int)P0.z._0_4_ < this->m_cv_count; P0.z._0_4_ = P0.z._0_4_ + 1) {
              if ((*_i != 0.0) || (NAN(*_i))) {
                P0.z._4_4_ = 0;
              }
              else {
                P0.z._4_4_ = P0.z._4_4_ + 1;
              }
              if (this->m_order <= P0.z._4_4_) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,
                                    "ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n",
                                    (ulong)((P0.z._0_4_ - this->m_order) + 1),(ulong)P0.z._0_4_);
                }
                bVar2 = ON_NurbsCurveIsNotValid();
                return bVar2;
              }
              if ((this->m_knot[(int)P0.z._0_4_] ==
                   this->m_knot[(int)(P0.z._0_4_ + this->m_order + -2)]) &&
                 (!NAN(this->m_knot[(int)P0.z._0_4_]) &&
                  !NAN(this->m_knot[(int)(P0.z._0_4_ + this->m_order + -2)]))) {
                if ((*_i == 0.0) && (!NAN(*_i))) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv has zero weights for CV[%d].\n",
                                      (ulong)P0.z._0_4_);
                  }
                  bVar2 = ON_NurbsCurveIsNotValid();
                  return bVar2;
                }
                if (((double)w != 0.0) || (NAN((double)w))) {
                  if (*_i * (double)w <= 0.0) {
                    if (text_log != (ON_TextLog *)0x0) {
                      ON_TextLog::Print(text_log,
                                        "ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n"
                                        ,this->m_knot[(int)(P0.z._0_4_ - 1)],
                                        SUB84(this->m_knot[(int)P0.z._0_4_],0));
                    }
                    bVar2 = ON_NurbsCurveIsNotValid();
                    return bVar2;
                  }
                }
                else {
                  w = (double *)
                      (~-(ulong)(0.0 < *_i) & 0xbff0000000000000 |
                      (ulong)((uint)(-(ulong)(0.0 < *_i) >> 0x20) & 0x3ff00000) << 0x20);
                }
              }
              _i = _i + this->m_cv_stride;
            }
            if (((this->m_dim < 4) && (this->m_order == 2)) && (this->m_cv_count == 2)) {
              ON_Curve::PointAtStart((ON_3dPoint *)&P1.z,&this->super_ON_Curve);
              ON_Curve::PointAtEnd((ON_3dPoint *)local_68,&this->super_ON_Curve);
              bVar2 = ON_3dPoint::operator==((ON_3dPoint *)&P1.z,(ON_3dPoint *)local_68);
              if (bVar2) {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"ON_NurbsCurve is a line with no length.\n");
                }
                bVar2 = ON_NurbsCurveIsNotValid();
                return bVar2;
              }
            }
          }
          this_local._7_1_ = true;
        }
        else {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv[] is not valid.\n");
          }
          this_local._7_1_ = ON_NurbsCurveIsNotValid();
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_NurbsCurve.m_knot[] is not a valid knot vector.\n");
        }
        this_local._7_1_ = ON_NurbsCurveIsNotValid();
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::IsValid( ON_TextLog* text_log ) const
{
  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_dim = %d (should be > 0).\n",m_dim);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_order = %d (should be >= 2).\n",m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_count < m_order )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n",m_cv_count,m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_stride < CVSize() )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n",m_cv_stride,CVSize());
    }
  }
  
  if (m_cv == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_knot == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_IsValidKnotVector( m_order, m_cv_count, m_knot, text_log ) ) 
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot[] is not a valid knot vector.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_ControlPointsAreValid(CVSize(),m_cv_count,m_cv_stride,m_cv,text_log) )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv[] is not valid.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( m_is_rat )
  {
    // weights at fully multiple knots must be nonzero
    // partial test for weight function being zero
    double sign = 0.0;
    const double* w = &m_cv[m_dim];
    int zcount = 0;
    int i;
    for ( i = 0; i < m_cv_count; i++, w += m_cv_stride )
    {
      if ( *w == 0.0 )
        zcount++;
      else
        zcount = 0;

      if ( zcount >= m_order )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n",i-m_order+1,i);
        }
        return ON_NurbsCurveIsNotValid(); // denominator is zero for entire span
      }
      
      if ( m_knot[i] == m_knot[i+m_order-2] ) 
      {
        if ( *w == 0.0 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d].\n",i);
          }
          return ON_NurbsCurveIsNotValid();
        }
        
        if (sign == 0.0) 
        {
          sign = (*w > 0.0) ? 1.0 : -1.0;
        }
        else if ( *w * sign <= 0.0 ) 
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n",
                            m_knot[i-1],m_knot[i]);
          }
          return ON_NurbsCurveIsNotValid();
        }
      }
    }

    if ( m_dim <= 3 && 2 == m_order && 2 == m_cv_count )
    {
      // fix for RR 21239
      // 16 November 2010 Chuck and Dale Lear added m_dim <= 3
      // so the 3d checking does not interfere with applications
      // that use high dimension curves where the start and end
      // points can be arbitrary.
      ON_3dPoint P0 = PointAtStart();
      ON_3dPoint P1 = PointAtEnd();
      if ( P0 == P1 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve is a line with no length.\n");
        }
        return ON_NurbsCurveIsNotValid();
      }
    }
  }

  return true;
}